

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_controller.cpp
# Opt level: O2

void __thiscall
TransactionController_CreateP2wpkhSignatureHash_Test_Test::TestBody
          (TransactionController_CreateP2wpkhSignatureHash_Test_Test *this)

{
  bool bVar1;
  char *message;
  Amount AVar2;
  AssertionResult gtest_ar;
  AssertHelper local_138;
  string local_130;
  ByteData sighash;
  string expect_sighash;
  Amount local_d8;
  TransactionController txc;
  Pubkey pubkey;
  SigHashType local_60;
  SigHashType sighash_type;
  Txid txid;
  string tx;
  
  std::__cxx11::string::string
            ((string *)&tx,
             "0200000001efcdab89674523010000000000000000000000000000000000000000000000000000000000ffffffff01406f4001000000001976a9144b8fe2da0c979ec6027dc2287e65569f41d483ec88ac00000000"
             ,(allocator *)&txc);
  std::__cxx11::string::string
            ((string *)&txc,"0000000000000000000000000000000000000000000000000123456789abcdef",
             (allocator *)&expect_sighash);
  cfd::core::Txid::Txid(&txid,(string *)&txc);
  std::__cxx11::string::~string((string *)&txc);
  std::__cxx11::string::string
            ((string *)&txc,"023e5e7a4a435f526a8b34d54c7355c8e57392b591b5a189ec88731953c568f8da",
             (allocator *)&expect_sighash);
  cfd::core::Pubkey::Pubkey(&pubkey,(string *)&txc);
  std::__cxx11::string::~string((string *)&txc);
  cfd::core::SigHashType::SigHashType(&sighash_type,kSigHashAll,false,false);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(21000000);
  local_d8.amount_ = AVar2.amount_;
  local_d8.ignore_check_ = AVar2.ignore_check_;
  std::__cxx11::string::string
            ((string *)&expect_sighash,
             "a3f0fa9b3e727bb746509b40a7cac316bf36685d55bebd6c7271d6e3a976f12d",(allocator *)&txc);
  cfd::TransactionController::TransactionController(&txc,&tx);
  cfd::core::ByteData::ByteData(&sighash);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SigHashType(&local_60,&sighash_type);
      cfd::TransactionController::CreateSignatureHash
                ((ByteData *)&local_130,&txc,&txid,0,&pubkey,&local_60,&local_d8,kVersion0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash,&local_130);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130);
    }
  }
  else {
    testing::Message::Message((Message *)&local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_controller.cpp"
               ,0x46,
               "Expected: sighash = txc.CreateSignatureHash(txid, vout, pubkey, sighash_type, amount, WitnessVersion::kVersion0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_130,&sighash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"sighash.GetHex().c_str()","expect_sighash.c_str()",
             local_130._M_dataplus._M_p,expect_sighash._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_130);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_controller.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  cfd::TransactionController::~TransactionController(&txc);
  std::__cxx11::string::~string((string *)&expect_sighash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  cfd::core::Txid::~Txid(&txid);
  std::__cxx11::string::~string((string *)&tx);
  return;
}

Assistant:

TEST(TransactionController, CreateP2wpkhSignatureHash_Test) {
  // input-only transaction
  std::string tx = "0200000001efcdab89674523010000000000000000000000000000000000000000000000000000000000ffffffff01406f4001000000001976a9144b8fe2da0c979ec6027dc2287e65569f41d483ec88ac00000000";
  Txid txid("0000000000000000000000000000000000000000000000000123456789abcdef");
  uint32_t vout = 0;
  Pubkey pubkey("023e5e7a4a435f526a8b34d54c7355c8e57392b591b5a189ec88731953c568f8da");
  SigHashType sighash_type(SigHashAlgorithm::kSigHashAll);
  Amount amount = Amount::CreateBySatoshiAmount(21000000);

  std::string expect_sighash = "a3f0fa9b3e727bb746509b40a7cac316bf36685d55bebd6c7271d6e3a976f12d";
  
  TransactionController txc(tx);
  ByteData sighash;
  EXPECT_NO_THROW(sighash = txc.CreateSignatureHash(txid, vout, pubkey, sighash_type, amount, WitnessVersion::kVersion0));
  
  EXPECT_STREQ(sighash.GetHex().c_str(), expect_sighash.c_str());
}